

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O2

UniValue * __thiscall
GetinfoRequestHandler::ProcessReply
          (UniValue *__return_storage_ptr__,GetinfoRequestHandler *this,UniValue *batch_in)

{
  int iVar1;
  VType VVar2;
  long lVar3;
  string str;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string str_00;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  string key_10;
  string key_11;
  string key_12;
  string key_13;
  string key_14;
  string key_15;
  string key_16;
  string key_17;
  string key_18;
  UniValue result_00;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  UniValue val_10;
  UniValue val_11;
  UniValue val_12;
  UniValue val_13;
  UniValue val_14;
  UniValue val_15;
  UniValue val_16;
  UniValue val_17;
  UniValue val_18;
  UniValue error;
  pointer pUVar4;
  undefined1 auVar5 [56];
  UniValue *pUVar6;
  long in_FS_OFFSET;
  undefined1 auStack_c18 [16];
  vector<UniValue,_std::allocator<UniValue>_> batch;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined1 auStack_be0 [16];
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined1 in_stack_fffffffffffff440 [32];
  undefined1 in_stack_fffffffffffff460 [56];
  _Optional_payload_base<UniValue> in_stack_fffffffffffff498;
  UniValue local_ae0;
  string local_a88 [32];
  UniValue local_a68;
  string local_a10 [32];
  string local_9f0;
  UniValue local_9d0;
  string local_978 [32];
  UniValue local_958;
  string local_900 [32];
  UniValue local_8e0;
  string local_888 [32];
  UniValue local_868;
  string local_810 [32];
  UniValue local_7f0;
  string local_798 [32];
  UniValue local_778;
  string local_720 [32];
  UniValue local_700;
  string local_6a8 [32];
  UniValue local_688;
  string local_630 [32];
  UniValue local_610;
  string local_5b8 [32];
  UniValue local_598;
  string local_540 [32];
  UniValue local_520;
  string local_4c8 [32];
  UniValue local_4a8;
  string local_450 [32];
  string local_430;
  UniValue local_410;
  string local_3b8 [32];
  undefined1 *local_398;
  undefined8 local_390;
  undefined1 local_388 [16];
  UniValue connections;
  UniValue local_320;
  string local_2c8 [32];
  UniValue local_2a8;
  string local_250 [32];
  UniValue local_230;
  string local_1d8 [32];
  UniValue local_1b8;
  string local_160 [32];
  string local_140;
  UniValue local_120;
  string local_c8 [32];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  UniValue result;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  str.field_2._M_allocated_capacity =
       (size_type)
       batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
       ._M_start;
  str._0_16_ = auStack_c18;
  str.field_2._8_8_ =
       batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  UniValue::UniValue(&result,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_a8);
  JSONRPCProcessBatchReply(&batch,batch_in);
  pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->ID_NETWORKINFO;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&connections,"error",(allocator<char> *)&local_140);
  pUVar6 = UniValue::operator[](pUVar4 + iVar1,(string *)&connections);
  VVar2 = pUVar6->typ;
  std::__cxx11::string::~string((string *)&connections);
  pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (VVar2 == VNULL) {
    iVar1 = this->ID_BLOCKCHAININFO;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&connections,"error",(allocator<char> *)&local_140);
    pUVar6 = UniValue::operator[](pUVar4 + iVar1,(string *)&connections);
    VVar2 = pUVar6->typ;
    std::__cxx11::string::~string((string *)&connections);
    if (VVar2 == VNULL) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_c8,"version",(allocator<char> *)&local_430);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_NETWORKINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&connections,"result",(allocator<char> *)&local_9f0);
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,(string *)&connections);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"version",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar6,&local_140);
      UniValue::UniValue(&local_120,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key._M_string_length = auStack_c18._8_8_;
      key.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_;
      val._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
      val.val._M_dataplus._M_p = (pointer)local_bf0;
      val.val._M_string_length = uStack_be8;
      val.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003c93 = auVar5;
      UniValue::pushKV(&result,key,val);
      UniValue::~UniValue(&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&connections);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_160,"blocks",(allocator<char> *)&local_430);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_BLOCKCHAININFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&connections,"result",(allocator<char> *)&local_9f0);
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,(string *)&connections);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"blocks",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar6,&local_140);
      UniValue::UniValue(&local_1b8,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_00.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_00._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_00._M_string_length = auStack_c18._8_8_;
      key_00.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_00.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_00._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_00.val._M_dataplus._M_p = (pointer)local_bf0;
      val_00.val._M_string_length = uStack_be8;
      val_00.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003ccb = auVar5;
      UniValue::pushKV(&result,key_00,val_00);
      UniValue::~UniValue(&local_1b8);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&connections);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1d8,"headers",(allocator<char> *)&local_430);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_BLOCKCHAININFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&connections,"result",(allocator<char> *)&local_9f0);
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,(string *)&connections);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"headers",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar6,&local_140);
      UniValue::UniValue(&local_230,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_01.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_01._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_01._M_string_length = auStack_c18._8_8_;
      key_01.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_01.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_01._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_01.val._M_dataplus._M_p = (pointer)local_bf0;
      val_01.val._M_string_length = uStack_be8;
      val_01.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003d03 = auVar5;
      UniValue::pushKV(&result,key_01,val_01);
      UniValue::~UniValue(&local_230);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&connections);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_250,"verificationprogress",(allocator<char> *)&local_430);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_BLOCKCHAININFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&connections,"result",(allocator<char> *)&local_9f0);
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,(string *)&connections);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"verificationprogress",(allocator<char> *)(auStack_c18 + 0xf))
      ;
      pUVar6 = UniValue::operator[](pUVar6,&local_140);
      UniValue::UniValue(&local_2a8,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_02.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_02._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_02._M_string_length = auStack_c18._8_8_;
      key_02.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_02.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_02._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_02.val._M_dataplus._M_p = (pointer)local_bf0;
      val_02.val._M_string_length = uStack_be8;
      val_02.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003d3b = auVar5;
      UniValue::pushKV(&result,key_02,val_02);
      UniValue::~UniValue(&local_2a8);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&connections);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::string<std::allocator<char>>
                (local_2c8,"timeoffset",(allocator<char> *)&local_430);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_NETWORKINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&connections,"result",(allocator<char> *)&local_9f0);
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,(string *)&connections);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"timeoffset",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar6,&local_140);
      UniValue::UniValue(&local_320,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_03.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_03._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_03._M_string_length = auStack_c18._8_8_;
      key_03.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_03.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_03._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_03.val._M_dataplus._M_p = (pointer)local_bf0;
      val_03.val._M_string_length = uStack_be8;
      val_03.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003d73 = auVar5;
      UniValue::pushKV(&result,key_03,val_03);
      UniValue::~UniValue(&local_320);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&connections);
      std::__cxx11::string::~string(local_2c8);
      local_398 = local_388;
      local_390 = 0;
      local_388[0] = 0;
      str_00.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      str_00._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      str_00._M_string_length = auStack_c18._8_8_;
      str_00.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      UniValue::UniValue(&connections,VOBJ,str_00);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::string<std::allocator<char>>
                (local_3b8,"in",(allocator<char> *)&local_9f0);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_NETWORKINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"connections_in",(allocator<char> *)(auStack_c18 + 0xe));
      pUVar6 = UniValue::operator[](pUVar6,&local_430);
      UniValue::UniValue(&local_410,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_04.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_04._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_04._M_string_length = auStack_c18._8_8_;
      key_04.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_04.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_04._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_04.val._M_dataplus._M_p = (pointer)local_bf0;
      val_04.val._M_string_length = uStack_be8;
      val_04.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003e53 = auVar5;
      UniValue::pushKV(&connections,key_04,val_04);
      UniValue::~UniValue(&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_450,"out",(allocator<char> *)&local_9f0);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_NETWORKINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"connections_out",(allocator<char> *)(auStack_c18 + 0xe));
      pUVar6 = UniValue::operator[](pUVar6,&local_430);
      UniValue::UniValue(&local_4a8,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_05.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_05._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_05._M_string_length = auStack_c18._8_8_;
      key_05.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_05.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_05._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_05.val._M_dataplus._M_p = (pointer)local_bf0;
      val_05.val._M_string_length = uStack_be8;
      val_05.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003ec3 = auVar5;
      UniValue::pushKV(&connections,key_05,val_05);
      UniValue::~UniValue(&local_4a8);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_450);
      std::__cxx11::string::string<std::allocator<char>>
                (local_4c8,"total",(allocator<char> *)&local_9f0);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_NETWORKINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"connections",(allocator<char> *)(auStack_c18 + 0xe));
      pUVar6 = UniValue::operator[](pUVar6,&local_430);
      UniValue::UniValue(&local_520,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_06.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_06._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_06._M_string_length = auStack_c18._8_8_;
      key_06.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_06.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_06._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_06.val._M_dataplus._M_p = (pointer)local_bf0;
      val_06.val._M_string_length = uStack_be8;
      val_06.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003efb = auVar5;
      UniValue::pushKV(&connections,key_06,val_06);
      UniValue::~UniValue(&local_520);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_4c8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_540,"connections",(allocator<char> *)&local_140);
      UniValue::UniValue(&local_598,&connections);
      auVar5 = stack0xfffffffffffff408;
      key_07.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_07._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_07._M_string_length = auStack_c18._8_8_;
      key_07.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_07.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_07._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_07.val._M_dataplus._M_p = (pointer)local_bf0;
      val_07.val._M_string_length = uStack_be8;
      val_07.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003e8b = auVar5;
      UniValue::pushKV(&result,key_07,val_07);
      UniValue::~UniValue(&local_598);
      std::__cxx11::string::~string(local_540);
      std::__cxx11::string::string<std::allocator<char>>
                (local_5b8,"networks",(allocator<char> *)&local_9f0);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_NETWORKINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"networks",(allocator<char> *)(auStack_c18 + 0xe));
      pUVar6 = UniValue::operator[](pUVar6,&local_430);
      UniValue::UniValue(&local_610,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_08.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_08._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_08._M_string_length = auStack_c18._8_8_;
      key_08.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_08.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_08._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_08.val._M_dataplus._M_p = (pointer)local_bf0;
      val_08.val._M_string_length = uStack_be8;
      val_08.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003dab = auVar5;
      UniValue::pushKV(&result,key_08,val_08);
      UniValue::~UniValue(&local_610);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_5b8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_630,"difficulty",(allocator<char> *)&local_9f0);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_BLOCKCHAININFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"difficulty",(allocator<char> *)(auStack_c18 + 0xe));
      pUVar6 = UniValue::operator[](pUVar6,&local_430);
      UniValue::UniValue(&local_688,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_09.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_09._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_09._M_string_length = auStack_c18._8_8_;
      key_09.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_09.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_09._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_09.val._M_dataplus._M_p = (pointer)local_bf0;
      val_09.val._M_string_length = uStack_be8;
      val_09.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003e1b = auVar5;
      UniValue::pushKV(&result,key_09,val_09);
      UniValue::~UniValue(&local_688);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_630);
      std::__cxx11::string::string<std::allocator<char>>
                (local_6a8,"chain",(allocator<char> *)&local_9f0);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_BLOCKCHAININFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"chain",(allocator<char> *)(auStack_c18 + 0xe));
      pUVar6 = UniValue::operator[](pUVar6,&local_430);
      UniValue::UniValue(&local_700,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_10.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_10._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_10._M_string_length = auStack_c18._8_8_;
      key_10.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_10.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_10._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_10.val._M_dataplus._M_p = (pointer)local_bf0;
      val_10.val._M_string_length = uStack_be8;
      val_10.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10003de3 = auVar5;
      UniValue::pushKV(&result,key_10,val_10);
      UniValue::~UniValue(&local_700);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_6a8);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_WALLETINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)&local_430);
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      VVar2 = pUVar6->typ;
      std::__cxx11::string::~string((string *)&local_140);
      if (VVar2 != VNULL) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_720,"has_wallet",(allocator<char> *)&local_140);
        local_430._M_dataplus._M_p._0_1_ = 1;
        UniValue::UniValue<bool,_bool,_true>(&local_778,(bool *)&local_430);
        auVar5 = stack0xfffffffffffff408;
        key_11.field_2._M_allocated_capacity =
             (size_type)
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        key_11._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
        key_11._M_string_length = auStack_c18._8_8_;
        key_11.field_2._8_8_ =
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        val_11.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_;
        val_11._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
        val_11.val._M_dataplus._M_p = (pointer)local_bf0;
        val_11.val._M_string_length = uStack_be8;
        val_11.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auStack_be0;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
        unique0x10003f33 = auVar5;
        UniValue::pushKV(&result,key_11,val_11);
        UniValue::~UniValue(&local_778);
        std::__cxx11::string::~string(local_720);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_798,"keypoolsize",(allocator<char> *)&local_9f0);
        pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = this->ID_WALLETINFO;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
        pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"keypoolsize",(allocator<char> *)(auStack_c18 + 0xe));
        pUVar6 = UniValue::operator[](pUVar6,&local_430);
        UniValue::UniValue(&local_7f0,pUVar6);
        auVar5 = stack0xfffffffffffff408;
        key_12.field_2._M_allocated_capacity =
             (size_type)
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        key_12._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
        key_12._M_string_length = auStack_c18._8_8_;
        key_12.field_2._8_8_ =
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        val_12.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_;
        val_12._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
        val_12.val._M_dataplus._M_p = (pointer)local_bf0;
        val_12.val._M_string_length = uStack_be8;
        val_12.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auStack_be0;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
        unique0x10003f6b = auVar5;
        UniValue::pushKV(&result,key_12,val_12);
        UniValue::~UniValue(&local_7f0);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string(local_798);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_810,"walletname",(allocator<char> *)&local_9f0);
        pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = this->ID_WALLETINFO;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
        pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"walletname",(allocator<char> *)(auStack_c18 + 0xe));
        pUVar6 = UniValue::operator[](pUVar6,&local_430);
        UniValue::UniValue(&local_868,pUVar6);
        auVar5 = stack0xfffffffffffff408;
        key_13.field_2._M_allocated_capacity =
             (size_type)
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        key_13._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
        key_13._M_string_length = auStack_c18._8_8_;
        key_13.field_2._8_8_ =
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        val_13.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_;
        val_13._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
        val_13.val._M_dataplus._M_p = (pointer)local_bf0;
        val_13.val._M_string_length = uStack_be8;
        val_13.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auStack_be0;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
        unique0x10003fa3 = auVar5;
        UniValue::pushKV(&result,key_13,val_13);
        UniValue::~UniValue(&local_868);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string(local_810);
        pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = this->ID_WALLETINFO;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"result",(allocator<char> *)&local_9f0);
        pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"unlocked_until",(allocator<char> *)(auStack_c18 + 0xf));
        pUVar6 = UniValue::operator[](pUVar6,&local_430);
        VVar2 = pUVar6->typ;
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_140);
        if (VVar2 != VNULL) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_888,"unlocked_until",(allocator<char> *)&local_9f0);
          pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar1 = this->ID_WALLETINFO;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
          pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_430,"unlocked_until",(allocator<char> *)(auStack_c18 + 0xe));
          pUVar6 = UniValue::operator[](pUVar6,&local_430);
          UniValue::UniValue(&local_8e0,pUVar6);
          auVar5 = stack0xfffffffffffff408;
          key_14.field_2._M_allocated_capacity =
               (size_type)
               batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
          key_14._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
          key_14._M_string_length = auStack_c18._8_8_;
          key_14.field_2._8_8_ =
               batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
          val_14.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)in_stack_fffffffffffff440._0_8_;
          val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data =
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
          val_14.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._0_4_;
          val_14._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_;
          val_14.val._M_dataplus._M_p = (pointer)local_bf0;
          val_14.val._M_string_length = uStack_be8;
          val_14.val.field_2 =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )auStack_be0;
          val_14.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
          val_14.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
          unique0x10003fdb = auVar5;
          UniValue::pushKV(&result,key_14,val_14);
          UniValue::~UniValue(&local_8e0);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string(local_888);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  (local_900,"paytxfee",(allocator<char> *)&local_9f0);
        pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = this->ID_WALLETINFO;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
        pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"paytxfee",(allocator<char> *)(auStack_c18 + 0xe));
        pUVar6 = UniValue::operator[](pUVar6,&local_430);
        UniValue::UniValue(&local_958,pUVar6);
        auVar5 = stack0xfffffffffffff408;
        key_15.field_2._M_allocated_capacity =
             (size_type)
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        key_15._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
        key_15._M_string_length = auStack_c18._8_8_;
        key_15.field_2._8_8_ =
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        val_15.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_;
        val_15._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
        val_15.val._M_dataplus._M_p = (pointer)local_bf0;
        val_15.val._M_string_length = uStack_be8;
        val_15.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auStack_be0;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
        unique0x10004013 = auVar5;
        UniValue::pushKV(&result,key_15,val_15);
        UniValue::~UniValue(&local_958);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string(local_900);
      }
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_BALANCES;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)&local_430);
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      VVar2 = pUVar6->typ;
      std::__cxx11::string::~string((string *)&local_140);
      if (VVar2 != VNULL) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_978,"balance",(allocator<char> *)(auStack_c18 + 0xf));
        pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = this->ID_BALANCES;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xe));
        pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"mine",(allocator<char> *)(auStack_c18 + 0xd));
        pUVar6 = UniValue::operator[](pUVar6,&local_430);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9f0,"trusted",(allocator<char> *)(auStack_c18 + 0xc));
        pUVar6 = UniValue::operator[](pUVar6,&local_9f0);
        UniValue::UniValue(&local_9d0,pUVar6);
        auVar5 = stack0xfffffffffffff408;
        key_16.field_2._M_allocated_capacity =
             (size_type)
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        key_16._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
        key_16._M_string_length = auStack_c18._8_8_;
        key_16.field_2._8_8_ =
             batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        val_16.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffff440._0_8_;
        val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
        val_16.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_;
        val_16._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
        val_16.val._M_dataplus._M_p = (pointer)local_bf0;
        val_16.val._M_string_length = uStack_be8;
        val_16.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auStack_be0;
        val_16.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
        val_16.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
        unique0x1000404b = auVar5;
        UniValue::pushKV(&result,key_16,val_16);
        UniValue::~UniValue(&local_9d0);
        std::__cxx11::string::~string((string *)&local_9f0);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string(local_978);
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_a10,"relayfee",(allocator<char> *)&local_9f0);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_NETWORKINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"relayfee",(allocator<char> *)(auStack_c18 + 0xe));
      pUVar6 = UniValue::operator[](pUVar6,&local_430);
      UniValue::UniValue(&local_a68,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_17.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_17._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_17._M_string_length = auStack_c18._8_8_;
      key_17.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_17.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_17._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_17.val._M_dataplus._M_p = (pointer)local_bf0;
      val_17.val._M_string_length = uStack_be8;
      val_17.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x10004083 = auVar5;
      UniValue::pushKV(&result,key_17,val_17);
      UniValue::~UniValue(&local_a68);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_a10);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a88,"warnings",(allocator<char> *)&local_9f0);
      pUVar4 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->ID_NETWORKINFO;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"result",(allocator<char> *)(auStack_c18 + 0xf));
      pUVar6 = UniValue::operator[](pUVar4 + iVar1,&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"warnings",(allocator<char> *)(auStack_c18 + 0xe));
      pUVar6 = UniValue::operator[](pUVar6,&local_430);
      UniValue::UniValue(&local_ae0,pUVar6);
      auVar5 = stack0xfffffffffffff408;
      key_18.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      key_18._M_dataplus._M_p = (pointer)auStack_c18._0_8_;
      key_18._M_string_length = auStack_c18._8_8_;
      key_18.field_2._8_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff440._0_8_;
      val_18.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff440._8_24_;
      val_18.typ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_;
      val_18._4_4_ = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
      val_18.val._M_dataplus._M_p = (pointer)local_bf0;
      val_18.val._M_string_length = uStack_be8;
      val_18.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auStack_be0;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_bd0;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_bc8;
      unique0x100040bb = auVar5;
      UniValue::pushKV(&result,key_18,val_18);
      UniValue::~UniValue(&local_ae0);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string(local_a88);
      UniValue::UniValue((UniValue *)&stack0xfffffffffffff4c8,&result);
      UniValue::UniValue((UniValue *)&stack0xfffffffffffff470,&NullUniValue);
      local_140._M_dataplus._M_p._0_4_ = 1;
      std::_Optional_payload_base<UniValue>::_Optional_payload_base<int>
                ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffff410);
      result_00.val._M_string_length =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      result_00.typ = auStack_c18._0_4_;
      result_00._4_4_ = auStack_c18._4_4_;
      result_00.val._M_dataplus._M_p = (pointer)auStack_c18._8_8_;
      result_00.val.field_2._M_allocated_capacity =
           (size_type)
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      result_00._32_56_ = stack0xfffffffffffff408;
      error._32_56_ = in_stack_fffffffffffff460;
      error._0_32_ = in_stack_fffffffffffff440;
      JSONRPCReplyObj(__return_storage_ptr__,result_00,error,
                      (optional<UniValue>)in_stack_fffffffffffff498,
                      (JSONRPCVersion)&stack0xfffffffffffff4c8);
      std::_Optional_payload_base<UniValue>::_M_reset
                ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffff410);
      UniValue::~UniValue((UniValue *)&stack0xfffffffffffff470);
      UniValue::~UniValue((UniValue *)&stack0xfffffffffffff4c8);
      UniValue::~UniValue(&connections);
      goto LAB_0011d7c4;
    }
    pUVar6 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start + this->ID_BLOCKCHAININFO;
  }
  else {
    pUVar6 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start + this->ID_NETWORKINFO;
  }
  UniValue::UniValue(__return_storage_ptr__,pUVar6);
LAB_0011d7c4:
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&batch);
  UniValue::~UniValue(&result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ProcessReply(const UniValue &batch_in) override
    {
        UniValue result(UniValue::VOBJ);
        const std::vector<UniValue> batch = JSONRPCProcessBatchReply(batch_in);
        // Errors in getnetworkinfo() and getblockchaininfo() are fatal, pass them on;
        // getwalletinfo() and getbalances() are allowed to fail if there is no wallet.
        if (!batch[ID_NETWORKINFO]["error"].isNull()) {
            return batch[ID_NETWORKINFO];
        }
        if (!batch[ID_BLOCKCHAININFO]["error"].isNull()) {
            return batch[ID_BLOCKCHAININFO];
        }
        result.pushKV("version", batch[ID_NETWORKINFO]["result"]["version"]);
        result.pushKV("blocks", batch[ID_BLOCKCHAININFO]["result"]["blocks"]);
        result.pushKV("headers", batch[ID_BLOCKCHAININFO]["result"]["headers"]);
        result.pushKV("verificationprogress", batch[ID_BLOCKCHAININFO]["result"]["verificationprogress"]);
        result.pushKV("timeoffset", batch[ID_NETWORKINFO]["result"]["timeoffset"]);

        UniValue connections(UniValue::VOBJ);
        connections.pushKV("in", batch[ID_NETWORKINFO]["result"]["connections_in"]);
        connections.pushKV("out", batch[ID_NETWORKINFO]["result"]["connections_out"]);
        connections.pushKV("total", batch[ID_NETWORKINFO]["result"]["connections"]);
        result.pushKV("connections", std::move(connections));

        result.pushKV("networks", batch[ID_NETWORKINFO]["result"]["networks"]);
        result.pushKV("difficulty", batch[ID_BLOCKCHAININFO]["result"]["difficulty"]);
        result.pushKV("chain", UniValue(batch[ID_BLOCKCHAININFO]["result"]["chain"]));
        if (!batch[ID_WALLETINFO]["result"].isNull()) {
            result.pushKV("has_wallet", true);
            result.pushKV("keypoolsize", batch[ID_WALLETINFO]["result"]["keypoolsize"]);
            result.pushKV("walletname", batch[ID_WALLETINFO]["result"]["walletname"]);
            if (!batch[ID_WALLETINFO]["result"]["unlocked_until"].isNull()) {
                result.pushKV("unlocked_until", batch[ID_WALLETINFO]["result"]["unlocked_until"]);
            }
            result.pushKV("paytxfee", batch[ID_WALLETINFO]["result"]["paytxfee"]);
        }
        if (!batch[ID_BALANCES]["result"].isNull()) {
            result.pushKV("balance", batch[ID_BALANCES]["result"]["mine"]["trusted"]);
        }
        result.pushKV("relayfee", batch[ID_NETWORKINFO]["result"]["relayfee"]);
        result.pushKV("warnings", batch[ID_NETWORKINFO]["result"]["warnings"]);
        return JSONRPCReplyObj(std::move(result), NullUniValue,  /*id=*/1, JSONRPCVersion::V2);
    }